

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_crashes.cpp
# Opt level: O1

void __thiscall CrashTest_SigtermTest_Test::TestBody(CrashTest_SigtermTest_Test *this)

{
  DeathTest *pDVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  char *message;
  DeathTest *gtest_dt;
  scoped_ptr<testing::internal::DeathTest> gtest_dt_ptr;
  DeathTest *local_e8;
  DeathTest *local_e0;
  AssertHelper local_d8 [4];
  RE local_b8;
  
  bVar2 = testing::internal::AlwaysTrue();
  if (!bVar2) goto LAB_0010b9c3;
  testing::internal::RE::Init(&local_b8,"");
  bVar3 = testing::internal::DeathTest::Create
                    ("RaiseSigterm()",&local_b8,
                     "/workspace/llm4binary/github/license_c_cmakelists/ribtoks[P]chillout/src/tests/tests_crashes.cpp"
                     ,0x1e,&local_e8);
  bVar2 = true;
  if (bVar3) {
    if (local_e8 != (DeathTest *)0x0) {
      local_e0 = local_e8;
      iVar5 = (*local_e8->_vptr_DeathTest[2])();
      pDVar1 = local_e8;
      if (iVar5 == 0) {
        iVar5 = (*local_e8->_vptr_DeathTest[3])(local_e8);
        bVar2 = testing::internal::ExitedUnsuccessfully(iVar5);
        iVar5 = (*local_e8->_vptr_DeathTest[4])(local_e8,(ulong)bVar2);
        if ((char)iVar5 != '\0') goto LAB_0010b97a;
        bVar2 = true;
        bVar3 = false;
      }
      else {
        if (iVar5 == 1) {
          bVar2 = testing::internal::AlwaysTrue();
          if (bVar2) {
            RaiseSigterm();
          }
          (*local_e8->_vptr_DeathTest[5])(local_e8,2);
          (*pDVar1->_vptr_DeathTest[5])(pDVar1,0);
        }
LAB_0010b97a:
        bVar2 = false;
        bVar3 = true;
      }
      if (local_e0 != (DeathTest *)0x0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) && (local_e0 != (DeathTest *)0x0)) {
          (*local_e0->_vptr_DeathTest[1])();
        }
        local_e0 = (DeathTest *)0x0;
      }
      if (!bVar3) goto LAB_0010b9b5;
    }
    bVar2 = false;
  }
LAB_0010b9b5:
  testing::internal::RE::~RE(&local_b8);
  if (!bVar2) {
    return;
  }
LAB_0010b9c3:
  testing::Message::Message((Message *)&local_b8);
  message = testing::internal::DeathTest::LastMessage();
  testing::internal::AssertHelper::AssertHelper
            (local_d8,kFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ribtoks[P]chillout/src/tests/tests_crashes.cpp"
             ,0x1e,message);
  testing::internal::AssertHelper::operator=(local_d8,(Message *)&local_b8);
  testing::internal::AssertHelper::~AssertHelper(local_d8);
  if ((((long *)local_b8.pattern_ != (long *)0x0) &&
      (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
     ((long *)local_b8.pattern_ != (long *)0x0)) {
    (**(code **)(*(long *)local_b8.pattern_ + 8))();
  }
  return;
}

Assistant:

TEST (CrashTest, SigtermTest) {
    ASSERT_DEATH(RaiseSigterm(), "");
}